

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

int run_test_udp_ref2(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_f0 [8];
  uv_udp_t h;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,h.write_completed_queue + 1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x138,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  uv_udp_init(uVar2,local_f0);
  uv_udp_bind(local_f0,h.write_completed_queue + 1,0);
  uv_udp_recv_start(local_f0,fail_cb);
  uv_unref(local_f0);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(local_f0);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x13f,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}